

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::CheckLanguages
          (cmGlobalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,cmMakefile *mf)

{
  undefined8 uVar1;
  bool bVar2;
  string *psVar3;
  long lVar4;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48 [8];
  string architectures;
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *languages_local;
  cmGlobalNinjaGenerator *this_local;
  
  architectures.field_2._8_8_ = mf;
  bVar2 = ::cm::
          contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[8],_0>
                    (languages,(char (*) [8])0xc07341);
  if (bVar2) {
    this_local._7_1_ = CheckFortran(this,(cmMakefile *)architectures.field_2._8_8_);
  }
  else {
    bVar2 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                      (languages,(char (*) [5])"ISPC");
    if (bVar2) {
      this_local._7_1_ = CheckISPC(this,(cmMakefile *)architectures.field_2._8_8_);
    }
    else {
      bVar2 = ::cm::
              contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[6],_0>
                        (languages,(char (*) [6])0xc34496);
      uVar1 = architectures.field_2._8_8_;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"CMAKE_OSX_ARCHITECTURES",&local_69);
        psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_68);
        std::__cxx11::string::string(local_48,(string *)psVar3);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
        lVar4 = std::__cxx11::string::find_first_of((char)local_48,0x3b);
        uVar1 = architectures.field_2._8_8_;
        if (lVar4 != -1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,
                     "multiple values for CMAKE_OSX_ARCHITECTURES not supported with Swift",
                     &local_a1);
          cmMakefile::IssueMessage((cmMakefile *)uVar1,FATAL_ERROR,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
          cmSystemTools::SetFatalErrorOccurred();
          this_local._7_1_ = 0;
        }
        std::__cxx11::string::~string(local_48);
        if (lVar4 != -1) goto LAB_004bbce0;
      }
      this_local._7_1_ = 1;
    }
  }
LAB_004bbce0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::CheckLanguages(
  std::vector<std::string> const& languages, cmMakefile* mf) const
{
  if (cm::contains(languages, "Fortran")) {
    return this->CheckFortran(mf);
  }
  if (cm::contains(languages, "ISPC")) {
    return this->CheckISPC(mf);
  }
  if (cm::contains(languages, "Swift")) {
    const std::string architectures =
      mf->GetSafeDefinition("CMAKE_OSX_ARCHITECTURES");
    if (architectures.find_first_of(';') != std::string::npos) {
      mf->IssueMessage(MessageType::FATAL_ERROR,
                       "multiple values for CMAKE_OSX_ARCHITECTURES not "
                       "supported with Swift");
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }
  return true;
}